

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  bool bVar4;
  ImGuiWindow *pIVar5;
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [64];
  ImVec2 IVar8;
  undefined8 in_XMM1_Qb;
  ImRect IVar9;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 local_48;
  undefined8 local_40;
  ImVec2 local_38;
  undefined1 auVar7 [56];
  
  auVar7 = in_register_00001204._4_56_;
  pIVar5 = FindWindowByName(name);
  if ((pIVar5 == (ImGuiWindow *)0x0) || (pIVar5->BeginCount == 0)) {
    if (viewport_p == (ImGuiViewport *)0x0) {
      viewport_p = GetMainViewport();
    }
    IVar9 = ImGuiViewportP::GetBuildWorkRect((ImGuiViewportP *)viewport_p);
    IVar8 = IVar9.Max;
    auVar6._0_8_ = IVar9.Min;
    auVar6._8_56_ = auVar7;
    auVar1._8_8_ = in_XMM1_Qb;
    auVar1._0_4_ = IVar8.x;
    auVar1._4_4_ = IVar8.y;
    local_40 = vmovlps_avx(auVar1);
    pos = (ImVec2)vmovlps_avx(auVar6._0_16_);
    if ((dir | 2U) == 3) {
      uVar3 = (ulong)((dir & 0xfffffffeU) == 2);
      (&pos.x)[uVar3] = *(float *)((long)&local_40 + uVar3 * 4) - axis_size;
    }
    bVar4 = (dir & 0xfffffffeU) == 2;
    auVar2._8_8_ = in_XMM1_Qb;
    auVar2._0_4_ = IVar8.x;
    auVar2._4_4_ = IVar8.y;
    auVar1 = vsubps_avx(auVar2,auVar6._0_16_);
    local_38.x = 0.0;
    local_38.y = 0.0;
    size = (ImVec2)vmovlps_avx(auVar1);
    (&size.x)[bVar4] = axis_size;
    SetNextWindowPos(&pos,0,&local_38);
    SetNextWindowSize(&size,0);
    if ((dir & 0xfffffffdU) == 0) {
      (&((ImVec2 *)(&((ImGuiViewportP *)viewport_p)->DrawDataBuilder + 1))[2].x)[bVar4] =
           axis_size +
           (&((ImVec2 *)(&((ImGuiViewportP *)viewport_p)->DrawDataBuilder + 1))[2].x)[bVar4];
    }
    else if ((dir | 2U) == 3) {
      (&((ImVec2 *)(&((ImGuiViewportP *)viewport_p)->DrawDataBuilder + 1))[3].x)[bVar4] =
           (&((ImVec2 *)(&((ImGuiViewportP *)viewport_p)->DrawDataBuilder + 1))[3].x)[bVar4] -
           axis_size;
    }
  }
  PushStyleVar(3,0.0);
  local_48.x = 0.0;
  local_48.y = 0.0;
  PushStyleVar(5,&local_48);
  bVar4 = Begin(name,(bool *)0x0,window_flags | 7);
  PopStyleVar(2);
  return bVar4;
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}